

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int fficls(fitsfile *fptr,int fstcol,int ncols,char **ttype,char **tform,int *status)

{
  FITSfile *pFVar1;
  LONGLONG LVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long ninsert;
  long lVar13;
  bool bVar14;
  uint uVar15;
  int datacode;
  long width;
  LONGLONG tbcol;
  long repeat;
  int decims;
  char comm [73];
  int tstatus;
  char tfm [71];
  char card [81];
  char keyname [75];
  uint local_1f4;
  ulong local_1f0;
  long local_1e8;
  long local_1e0;
  LONGLONG local_1d8;
  ulong local_1d0;
  LONGLONG local_1c8;
  long local_1c0;
  int local_1b8;
  int local_1b4;
  char **local_1b0;
  char local_1a8 [88];
  ulong local_150;
  char **local_148;
  int local_13c;
  char local_138 [80];
  char local_e8 [4];
  undefined2 auStack_e4 [2];
  char local_e0 [8];
  char acStack_d8 [8];
  char acStack_d0 [8];
  char acStack_c8 [8];
  char acStack_c0 [6];
  undefined8 auStack_ba [6];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  uVar10 = (ulong)(uint)ncols;
  local_1f0 = CONCAT44(local_1f0._4_4_,fstcol);
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_00114d26;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (fptr->Fptr->hdutype == 0) {
    ffpmsg("Can only add columns to TABLE or BINTABLE extension (fficls)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((int)local_1f0 < 1) {
    *status = 0x12e;
    return 0x12e;
  }
  uVar15 = fptr->Fptr->tfield;
  local_1d0 = (ulong)uVar15;
  local_1b8 = uVar15 + 1;
  iVar3 = (int)local_1f0;
  if ((int)uVar15 < (int)local_1f0) {
    iVar3 = local_1b8;
  }
  local_1b0 = tform;
  local_150 = uVar10;
  local_148 = ttype;
  if (ncols < 1) {
    ninsert = 0;
  }
  else {
    uVar12 = 0;
    ninsert = 0;
    do {
      pcVar6 = local_1b0[uVar12];
      sVar5 = strlen(pcVar6);
      if (0x46 < sVar5) {
        ffpmsg("Column format string too long (fficls)");
        *status = 0x105;
        return 0x105;
      }
      strcpy(local_138,pcVar6);
      ffupch(local_138);
      if (fptr->Fptr->hdutype == 1) {
        ffasfm(local_138,(int *)&local_1f4,&local_1e8,&local_1b4,status);
        lVar7 = local_1e8 + 1;
      }
      else {
        ffbnfm(local_138,(int *)&local_1f4,&local_1c0,&local_1e8,status);
        if ((int)local_1f4 < 0) {
          pcVar6 = strchr(local_138,0x51);
          lVar7 = (ulong)(pcVar6 != (char *)0x0) * 8 + 8;
        }
        else {
          lVar7 = local_1c0;
          if (local_1f4 != 0x10) {
            if (local_1f4 == 1) {
              lVar7 = local_1c0 + 0xe;
              if (-1 < local_1c0 + 7) {
                lVar7 = local_1c0 + 7;
              }
              lVar7 = lVar7 >> 3;
            }
            else {
              lVar7 = ((ulong)local_1f4 / 10) * local_1c0;
            }
          }
        }
      }
      ninsert = ninsert + lVar7;
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  if (0 < *status) {
    return *status;
  }
  pFVar1 = fptr->Fptr;
  lVar7 = pFVar1->numrows;
  local_1d8 = pFVar1->rowlength;
  lVar9 = (pFVar1->heapsize + pFVar1->heapstart + 0xb3f) % 0xb40;
  lVar13 = lVar7 * ninsert;
  if ((lVar13 <= 0xb3f - lVar9) ||
     (iVar4 = ffiblk(fptr,(lVar9 + lVar13) / 0xb40,1,status), iVar4 < 1)) {
    pFVar1 = fptr->Fptr;
    if ((pFVar1->heapsize < 1) ||
       (iVar4 = ffshft(fptr,pFVar1->heapstart + pFVar1->datastart,pFVar1->heapsize,lVar13,status),
       iVar4 < 1)) {
      lVar13 = lVar13 + fptr->Fptr->heapstart;
      fptr->Fptr->heapstart = lVar13;
      local_13c = 0;
      ffmkyj(fptr,"THEAP",lVar13,"&",&local_13c);
      iVar4 = (int)local_1d0;
      local_1c8 = local_1d8;
      if ((int)local_1f0 <= iVar4) {
        local_1c8 = fptr->Fptr->tableptr[(long)iVar3 + -1].tbcol;
      }
      ffcins(fptr,local_1d8,lVar7,ninsert,local_1c8,status);
      if (0 < iVar4 && fptr->Fptr->hdutype == 1) {
        iVar11 = (int)local_1d0;
        iVar4 = 1;
        do {
          ffkeyn("TBCOL",iVar4,local_88,status);
          ffgkyjj(fptr,local_88,&local_1e0,local_1a8,status);
          if (local_1c8 < local_1e0) {
            local_1e0 = local_1e0 + ninsert;
            ffmkyj(fptr,local_88,local_1e0,"&",status);
          }
          bVar14 = iVar4 != iVar11;
          iVar4 = iVar4 + 1;
        } while (bVar14);
      }
      uVar10 = local_150;
      iVar4 = (int)local_150;
      iVar11 = (int)local_1d0;
      ffmkyj(fptr,"TFIELDS",(long)(iVar4 + iVar11),"&",status);
      ffmkyj(fptr,"NAXIS1",local_1d8 + ninsert,"&",status);
      if ((int)local_1f0 <= iVar11) {
        ffkshf(fptr,iVar3,iVar11,iVar4,status);
      }
      if (0 < iVar4) {
        local_1f0 = uVar10 & 0xffffffff;
        uVar10 = 0;
        do {
          builtin_strncpy(local_1a8,"label for field",0x10);
          ffkeyn("TTYPE",iVar3,local_88,status);
          ffpkys(fptr,local_88,local_148[uVar10],local_1a8,status);
          builtin_strncpy(local_1a8,"format of field",0x10);
          strcpy(local_138,local_1b0[uVar10]);
          ffupch(local_138);
          ffkeyn("TFORM",iVar3,local_88,status);
          uVar15 = -local_1f4;
          if (0 < (int)local_1f4) {
            uVar15 = local_1f4;
          }
          if ((int)uVar15 < 0x28) {
            if (uVar15 == 0xc) {
              pcVar6 = local_138;
              do {
                pcVar8 = pcVar6;
                pcVar6 = pcVar8 + 1;
              } while (*pcVar8 != 'S');
              *pcVar8 = 'B';
              ffpkys(fptr,local_88,local_138,local_1a8,status);
              ffkeyn("TZERO",iVar3,local_88,status);
              builtin_strncpy(local_1a8 + 0x10,"d bytes",8);
              builtin_strncpy(local_1a8 + 10," signe",6);
              uVar15 = 0xc0600000;
LAB_00114c0f:
              builtin_strncpy(local_1a8,"offset for",10);
              ffpkyg(fptr,local_88,(double)((ulong)uVar15 << 0x20),0,local_1a8,status);
              ffkeyn("TSCAL",iVar3,local_88,status);
              goto LAB_00114c58;
            }
            if (uVar15 == 0x14) {
              pcVar6 = local_138;
              do {
                pcVar8 = pcVar6;
                pcVar6 = pcVar8 + 1;
              } while (*pcVar8 != 'U');
              *pcVar8 = 'I';
              ffpkys(fptr,local_88,local_138,local_1a8,status);
              ffkeyn("TZERO",iVar3,local_88,status);
              builtin_strncpy(local_1a8 + 10," unsigned integers",0x13);
              uVar15 = 0x40e00000;
              goto LAB_00114c0f;
            }
LAB_00114af5:
            ffpkys(fptr,local_88,local_138,local_1a8,status);
          }
          else {
            if (uVar15 == 0x28) {
              pcVar6 = local_138;
              do {
                pcVar8 = pcVar6;
                pcVar6 = pcVar8 + 1;
              } while (*pcVar8 != 'V');
              *pcVar8 = 'J';
              ffpkys(fptr,local_88,local_138,local_1a8,status);
              ffkeyn("TZERO",iVar3,local_88,status);
              builtin_strncpy(local_1a8 + 10," unsigned integers",0x13);
              uVar15 = 0x41e00000;
              goto LAB_00114c0f;
            }
            if (uVar15 != 0x50) goto LAB_00114af5;
            pcVar6 = local_138;
            do {
              pcVar8 = pcVar6;
              pcVar6 = pcVar8 + 1;
            } while (*pcVar8 != 'W');
            *pcVar8 = 'K';
            ffpkys(fptr,local_88,local_138,local_1a8,status);
            ffkeyn("TZERO",iVar3,local_e8,status);
            sVar5 = strlen(local_e8);
            builtin_strncpy(local_e8 + sVar5,"    ",4);
            *(undefined2 *)((long)auStack_e4 + sVar5) = 0x20;
            local_e0[0] = '\0';
            sVar5 = strlen(local_e8);
            *(undefined8 *)((long)auStack_ba + sVar5) = 0x7372656765746e;
            builtin_strncpy(local_e8 + sVar5,"=  92233",8);
            builtin_strncpy(local_e0 + sVar5,"72036854",8);
            builtin_strncpy(acStack_d8 + sVar5,"775808 /",8);
            builtin_strncpy(acStack_d0 + sVar5," offset ",8);
            builtin_strncpy(acStack_c8 + sVar5,"for unsi",8);
            builtin_strncpy(acStack_c0 + sVar5,"gned int",8);
            ffprec(fptr,local_e8,status);
            ffkeyn("TSCAL",iVar3,local_88,status);
LAB_00114c58:
            builtin_strncpy(local_1a8,"data are not scaled",0x14);
            ffpkyg(fptr,local_88,1.0,0,local_1a8,status);
          }
          LVar2 = local_1c8;
          if (fptr->Fptr->hdutype == 1) {
            local_1e0 = (ulong)(iVar3 == local_1b8) + 1 + local_1c8;
            builtin_strncpy(local_1a8,"beginning column of field",0x1a);
            ffkeyn("TBCOL",iVar3,local_88,status);
            ffpkyj(fptr,local_88,local_1e0,local_1a8,status);
            ffasfm(local_138,(int *)&local_1f4,&local_1e8,&local_1b4,status);
            local_1c8 = LVar2 + local_1e8 + 1;
          }
          uVar10 = uVar10 + 1;
          iVar3 = iVar3 + 1;
        } while (uVar10 != local_1f0);
      }
      ffrdef(fptr,status);
    }
  }
LAB_00114d26:
  return *status;
}

Assistant:

int fficls(fitsfile *fptr,  /* I - FITS file pointer                        */
           int fstcol,      /* I - position for first new col. (1 = 1st)    */
           int ncols,       /* I - number of columns to insert              */
           char **ttype,    /* I - array of column names(TTYPE keywords)    */
           char **tform,    /* I - array of formats of column (TFORM)       */
           int *status)     /* IO - error status                            */
/*
 Insert 1 or more new columns into an existing table at position numcol.  If
 fstcol is greater than the number of existing columns in the table
 then the new column will be appended as the last column in the table.
*/
{
    int colnum, datacode, decims, tfields, tstatus, ii;
    LONGLONG datasize, firstbyte, nbytes, nadd, naxis1, naxis2, freespace;
    LONGLONG tbcol, firstcol, delbyte;
    long nblock, width, repeat;
    char tfm[FLEN_VALUE], keyname[FLEN_KEYWORD], comm[FLEN_COMMENT], *cptr;
    char card[FLEN_CARD];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg("Can only add columns to TABLE or BINTABLE extension (fficls)");
       return(*status = NOT_TABLE);
    }

    /*  is the column number valid?  */
    tfields = (fptr->Fptr)->tfield;
    if (fstcol < 1 )
        return(*status = BAD_COL_NUM);
    else if (fstcol > tfields)
        colnum = tfields + 1;   /* append as last column */
    else
        colnum = fstcol;

    /* parse the tform value and calc number of bytes to add to each row */
    delbyte = 0;
    for (ii = 0; ii < ncols; ii++)
    {
        if (strlen(tform[ii]) > FLEN_VALUE-1)
        {
           ffpmsg("Column format string too long (fficls)");
           return (*status=BAD_TFORM);
        }
        strcpy(tfm, tform[ii]);
        ffupch(tfm);         /* make sure format is in upper case */

        if ((fptr->Fptr)->hdutype == ASCII_TBL)
        {
            ffasfm(tfm, &datacode, &width, &decims, status);
            delbyte += width + 1;  /*  add one space between the columns */
        }
        else
        {
            ffbnfm(tfm, &datacode, &repeat, &width, status);

            if (datacode < 0)  {       /* variable length array column */
	        if (strchr(tfm, 'Q'))
		  delbyte += 16;
		else
                  delbyte += 8;
            } else if (datacode == 1)          /* bit column; round up  */
                delbyte += (repeat + 7) / 8; /* to multiple of 8 bits */
            else if (datacode == 16)  /* ASCII string column */
                delbyte += repeat;
            else                      /* numerical data type */
                delbyte += (datacode / 10) * repeat;
        }
    }

    if (*status > 0) 
        return(*status);

    /* get the current size of the table */
    /* use internal structure since NAXIS2 keyword may not be up to date */
    naxis1 = (fptr->Fptr)->rowlength;
    naxis2 = (fptr->Fptr)->numrows;

    /* current size of data */
    datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
    freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;
    nadd = delbyte * naxis2;   /* no. of bytes to add to table */

    if ( (freespace - nadd) < 0)   /* not enough existing space? */
    {
        nblock = (long) ((nadd - freespace + 2879) / 2880);     /* number of blocks  */
        if (ffiblk(fptr, nblock, 1, status) > 0)       /* insert the blocks */
            return(*status);
    }

    /* shift heap down (if it exists) */
    if ((fptr->Fptr)->heapsize > 0)
    {
        nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift down */

        /* absolute heap pos */
        firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;

        if (ffshft(fptr, firstbyte, nbytes, nadd, status) > 0) /* move heap */
            return(*status);
    }

    /* update the heap starting address */
    (fptr->Fptr)->heapstart += nadd;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);

    /* calculate byte position in the row where to insert the new column */
    if (colnum > tfields)
        firstcol = naxis1;
    else
    {
        colptr = (fptr->Fptr)->tableptr;
        colptr += (colnum - 1);
        firstcol = colptr->tbcol;
    }

    /* insert delbyte bytes in every row, at byte position firstcol */
    ffcins(fptr, naxis1, naxis2, delbyte, firstcol, status);

    if ((fptr->Fptr)->hdutype == ASCII_TBL)
    {
        /* adjust the TBCOL values of the existing columns */
        for(ii = 0; ii < tfields; ii++)
        {
            ffkeyn("TBCOL", ii + 1, keyname, status);
            ffgkyjj(fptr, keyname, &tbcol, comm, status);
            if (tbcol > firstcol)
            {
                tbcol += delbyte;
                ffmkyj(fptr, keyname, tbcol, "&", status);
            }
        }
    }

    /* update the mandatory keywords */
    ffmkyj(fptr, "TFIELDS", tfields + ncols, "&", status);
    ffmkyj(fptr, "NAXIS1", naxis1 + delbyte, "&", status);

    /* increment the index value on any existing column keywords */
    if(colnum <= tfields)
        ffkshf(fptr, colnum, tfields, ncols, status);

    /* add the required keywords for the new columns */
    for (ii = 0; ii < ncols; ii++, colnum++)
    {
        strcpy(comm, "label for field");
        ffkeyn("TTYPE", colnum, keyname, status);
        ffpkys(fptr, keyname, ttype[ii], comm, status);

        strcpy(comm, "format of field");
        strcpy(tfm, tform[ii]);
        ffupch(tfm);         /* make sure format is in upper case */
        ffkeyn("TFORM", colnum, keyname, status);

        if (abs(datacode) == TSBYTE) 
        {
           /* Replace the 'S' with an 'B' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'S') 
              cptr++;

           *cptr = 'B';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, keyname, status);
           strcpy(comm, "offset for signed bytes");

           ffpkyg(fptr, keyname, -128., 0, comm, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else if (abs(datacode) == TUSHORT) 
        {
           /* Replace the 'U' with an 'I' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'U') 
              cptr++;

           *cptr = 'I';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, keyname, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, keyname, 32768., 0, comm, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else if (abs(datacode) == TULONG) 
        {
           /* Replace the 'V' with an 'J' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'V') 
              cptr++;

           *cptr = 'J';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, keyname, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, keyname, 2147483648., 0, comm, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else if (abs(datacode) == TULONGLONG) 
        {	   
           /* Replace the 'W' with an 'K' in the TFORMn code */
           cptr = tfm;
           while (*cptr != 'W') 
              cptr++;

           *cptr = 'K';
           ffpkys(fptr, keyname, tfm, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", colnum, card, status);
           strcat(card, "     ");  /* make sure name is >= 8 chars long */
           *(card+8) = '\0';
	   strcat(card, "=  9223372036854775808 / offset for unsigned integers");
	   fits_write_record(fptr, card, status);

           ffkeyn("TSCAL", colnum, keyname, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, keyname, 1., 0, comm, status);
        }
        else
        {
           ffpkys(fptr, keyname, tfm, comm, status);
        }

        if ((fptr->Fptr)->hdutype == ASCII_TBL)   /* write the TBCOL keyword */
        {
            if (colnum == tfields + 1)
                tbcol = firstcol + 2;  /* allow space between preceding col */
            else
                tbcol = firstcol + 1;

            strcpy(comm, "beginning column of field");
            ffkeyn("TBCOL", colnum, keyname, status);
            ffpkyj(fptr, keyname, tbcol, comm, status);

            /* increment the column starting position for the next column */
            ffasfm(tfm, &datacode, &width, &decims, status);
            firstcol += width + 1;  /*  add one space between the columns */
        }
    }
    ffrdef(fptr, status); /* initialize the new table structure */
    return(*status);
}